

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  bool bVar1;
  pointer pTVar2;
  Location local_b8;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_98;
  string local_90;
  string local_70;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> local_50;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  undefined1 auStack_30 [4];
  Type elem_type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::TableImport>();
  string_view::to_string_abi_cxx11_(&local_70,(string_view *)&field_name_local.size_);
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_50);
  std::__cxx11::string::operator=
            ((string *)&(pTVar2->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name,
             (string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  string_view::to_string_abi_cxx11_(&local_90,(string_view *)auStack_30);
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_50);
  std::__cxx11::string::operator=
            ((string *)&(pTVar2->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name,
             (string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_50);
  (pTVar2->table).elem_limits.initial = elem_limits->initial;
  (pTVar2->table).elem_limits.max = elem_limits->max;
  bVar1 = elem_limits->is_shared;
  (pTVar2->table).elem_limits.has_max = elem_limits->has_max;
  (pTVar2->table).elem_limits.is_shared = bVar1;
  (pTVar2->table).elem_limits.is_64 = elem_limits->is_64;
  pTVar2 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_50);
  (pTVar2->table).elem_type.enum_ = elem_type.enum_;
  this_00 = this->module_;
  GetLocation(&local_b8,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
            ((wabt *)&local_98,&local_50,&local_b8);
  Module::AppendField(this_00,&local_98);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_98);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
            (&local_50);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     string_view module_name,
                                     string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = MakeUnique<TableImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->table.elem_limits = *elem_limits;
  import->table.elem_type = elem_type;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}